

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Lu_solve(char tran,int g_a,int g_b)

{
  int in_EDX;
  char in_DIL;
  Integer t;
  Integer b;
  Integer a;
  Integer g_a_00;
  
  if ((in_DIL == 't') || (in_DIL == 'T')) {
    g_a_00 = 1;
  }
  else {
    g_a_00 = 0;
  }
  pnga_lu_solve_alt((long)in_EDX,g_a_00,0x117cc0);
  return;
}

Assistant:

void GA_Lu_solve(char tran, int g_a, int g_b)
{
    Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;

    Integer t;

    if(tran == 't' || tran == 'T') t = 1;
    else t = 0;

    wnga_lu_solve_alt(t, a, b);
}